

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * QuaternionToMatrix(Matrix *__return_storage_ptr__,Quaternion q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Matrix *result;
  float cd;
  float bd;
  float ad;
  float bc;
  float ac;
  float ab;
  float c2;
  float b2;
  float a2;
  Quaternion q_local;
  
  MatrixIdentity();
  b2 = q.x;
  fVar1 = b2 * b2 * 2.0;
  a2 = q.y;
  fVar2 = a2 * a2 * 2.0;
  q_local.x = q.z;
  fVar3 = q_local.x * q_local.x * 2.0;
  fVar4 = b2 * a2 * 2.0;
  fVar5 = b2 * q_local.x * 2.0;
  fVar6 = a2 * q_local.x * 2.0;
  q_local.y = q.w;
  fVar7 = b2 * q_local.y * 2.0;
  fVar8 = a2 * q_local.y * 2.0;
  fVar9 = q_local.x * q_local.y * 2.0;
  __return_storage_ptr__->m0 = (1.0 - fVar2) - fVar3;
  __return_storage_ptr__->m1 = fVar4 - fVar9;
  __return_storage_ptr__->m2 = fVar5 + fVar8;
  __return_storage_ptr__->m4 = fVar4 + fVar9;
  __return_storage_ptr__->m5 = (1.0 - fVar1) - fVar3;
  __return_storage_ptr__->m6 = fVar6 - fVar7;
  __return_storage_ptr__->m8 = fVar5 - fVar8;
  __return_storage_ptr__->m9 = fVar6 + fVar7;
  __return_storage_ptr__->m10 = (1.0 - fVar1) - fVar2;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix QuaternionToMatrix(Quaternion q)
{
    Matrix result = MatrixIdentity();

    float a2 = 2*(q.x*q.x), b2=2*(q.y*q.y), c2=2*(q.z*q.z); //, d2=2*(q.w*q.w);

    float ab = 2*(q.x*q.y), ac=2*(q.x*q.z), bc=2*(q.y*q.z);
    float ad = 2*(q.x*q.w), bd=2*(q.y*q.w), cd=2*(q.z*q.w);

    result.m0 = 1 - b2 - c2;
    result.m1 = ab - cd;
    result.m2 = ac + bd;

    result.m4 = ab + cd;
    result.m5 = 1 - a2 - c2;
    result.m6 = bc - ad;

    result.m8 = ac - bd;
    result.m9 = bc + ad;
    result.m10 = 1 - a2 - b2;

    return result;
}